

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  char *pcVar1;
  char *pcVar2;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  int in_R9D;
  char *k00;
  int j;
  int i;
  int k;
  int p;
  char *g00;
  int q;
  Mat kernel;
  int maxk;
  Allocator *in_stack_fffffffffffffec0;
  size_t _elemsize;
  int in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  Mat *in_stack_fffffffffffffee8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  Allocator *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  Mat *in_stack_ffffffffffffff78;
  int local_80;
  
  _elemsize = 0;
  Mat::reshape(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
              in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
              _elemsize,in_stack_fffffffffffffec0);
  for (local_80 = 0; local_80 + 3 < in_ECX; local_80 = local_80 + 4) {
    Mat::channel(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
    pcVar1 = Mat::operator_cast_to_signed_char_((Mat *)&stack0xffffffffffffff30);
    Mat::~Mat((Mat *)0x363933);
    for (local_d4 = 0; local_d4 + 7 < in_EDX; local_d4 = local_d4 + 8) {
      for (local_d8 = 0; local_d8 < in_R8D * in_R9D; local_d8 = local_d8 + 1) {
        for (local_dc = 0; local_dc < 4; local_dc = local_dc + 1) {
          for (local_e0 = 0; local_e0 < 8; local_e0 = local_e0 + 1) {
            Mat::channel(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
            pcVar2 = Mat::row<signed_char_const>
                               ((Mat *)&stack0xfffffffffffffed0,local_d4 + local_e0);
            Mat::~Mat((Mat *)0x3639e0);
            *pcVar1 = pcVar2[local_d8];
            pcVar1 = pcVar1 + 1;
          }
        }
      }
    }
  }
  Mat::~Mat((Mat *)0x363adb);
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8a-4b-maxk-inch/8a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(32 * maxk, inch / 8, outch / 4, (size_t)1u);

    for (int q = 0; q + 3 < outch; q += 4)
    {
        signed char* g00 = kernel_tm.channel(q / 4);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const signed char* k00 = kernel.channel(q + i).row<const signed char>(p + j);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
}